

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qminimaleglintegration.cpp
# Opt level: O0

QPlatformBackingStore * __thiscall
QMinimalEglIntegration::createPlatformBackingStore(QMinimalEglIntegration *this,QWindow *window)

{
  QPlatformBackingStore *pQVar1;
  
  pQVar1 = (QPlatformBackingStore *)operator_new(0x20);
  QMinimalEglBackingStore::QMinimalEglBackingStore((QMinimalEglBackingStore *)this,window);
  return pQVar1;
}

Assistant:

QPlatformBackingStore *QMinimalEglIntegration::createPlatformBackingStore(QWindow *window) const
{
#ifdef QEGL_EXTRA_DEBUG
    qWarning("QMinimalEglIntegration::createWindowSurface %p\n", window);
#endif
#ifndef QT_NO_OPENGL
    return new QMinimalEglBackingStore(window);
#else
    Q_UNUSED(window);
    return nullptr;
#endif
}